

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderGetProgramiv3Test::deinitPO(GeometryShaderGetProgramiv3Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_po_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))();
    this->m_po_id = 0;
  }
  return;
}

Assistant:

void GeometryShaderGetProgramiv3Test::deinitPO()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}
}